

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genGoto(InstructionGenerator *this,uint pos)

{
  Instruction local_18;
  uint local_14;
  InstructionGenerator *pIStack_10;
  uint pos_local;
  InstructionGenerator *this_local;
  
  local_18 = GOTO;
  local_14 = pos;
  pIStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_18);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,&local_14);
  return;
}

Assistant:

void InstructionGenerator::genGoto(unsigned int pos)
{
    bytecode->emplace_back(Instruction::GOTO);
    bytecode->emplace_back(pos);
}